

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-mul-mat0.c
# Opt level: O0

_Bool check_gradient(char *op_name,ggml_context *ctx0,ggml_tensor **x,ggml_tensor *f,int ndims,
                    int nargs,float eps,float max_error_abs,float max_error_rel)

{
  undefined8 uVar1;
  undefined8 uVar2;
  long lVar3;
  ggml_tensor *t;
  undefined8 in_RCX;
  long in_RDX;
  int idx;
  undefined8 in_RSI;
  undefined8 in_RDI;
  uint in_R8D;
  int in_R9D;
  float in_XMM0_Da;
  float fVar4;
  float fVar5;
  float fVar6;
  float in_XMM1_Da;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  float in_XMM2_Da;
  float error_rel;
  float error_abs;
  float g1;
  float g0;
  float f1;
  float f0;
  float x0;
  int64_t k;
  int64_t nelements;
  int i;
  ggml_cgraph *gb;
  ggml_cgraph *gf;
  int n_threads;
  double local_88;
  long local_60;
  uint local_4c;
  
  ggml_set_loss(in_RCX);
  uVar1 = ggml_new_graph_custom(in_RSI,0x800,1);
  ggml_build_forward_expand(uVar1,in_RCX);
  uVar2 = ggml_graph_dup(in_RSI,uVar1);
  ggml_build_backward_expand(in_RSI,in_RSI,uVar2,0);
  ggml_graph_compute_with_ctx(in_RSI,uVar1,1);
  ggml_graph_reset(uVar2);
  ggml_graph_compute_with_ctx(in_RSI,uVar2,1);
  ggml_graph_dump_dot(uVar1,0,"test-grad0-forward.dot");
  ggml_graph_dump_dot(uVar2,uVar1,"test-grad0-backward.dot");
  local_4c = 0;
  do {
    if (in_R9D <= (int)local_4c) {
      return true;
    }
    lVar3 = ggml_nelements(*(undefined8 *)(in_RDX + (long)(int)local_4c * 8));
    for (local_60 = 0; local_60 < lVar3; local_60 = local_60 + 1) {
      idx = (int)local_60;
      fVar4 = get_element(*(ggml_tensor **)(in_RDX + (long)(int)local_4c * 8),idx);
      set_element(*(ggml_tensor **)(in_RDX + (long)(int)local_4c * 8),idx,fVar4 + in_XMM0_Da);
      ggml_graph_compute_with_ctx(in_RSI,uVar1,1);
      fVar5 = (float)ggml_get_f32_1d(in_RCX,0);
      set_element(*(ggml_tensor **)(in_RDX + (long)(int)local_4c * 8),idx,fVar4 - in_XMM0_Da);
      ggml_graph_compute_with_ctx(in_RSI,uVar1,1);
      fVar6 = (float)ggml_get_f32_1d(in_RCX,0);
      fVar5 = (fVar5 - fVar6) / (in_XMM0_Da * 2.0);
      set_element(*(ggml_tensor **)(in_RDX + (long)(int)local_4c * 8),idx,fVar4);
      ggml_graph_reset(uVar2);
      ggml_graph_compute_with_ctx(in_RSI,uVar2,1);
      t = (ggml_tensor *)
          ggml_graph_get_grad(uVar2,*(undefined8 *)(in_RDX + (long)(int)local_4c * 8));
      fVar4 = get_element(t,idx);
      auVar7._8_4_ = 0x7fffffff;
      auVar7._0_8_ = 0x7fffffff7fffffff;
      auVar7._12_4_ = 0x7fffffff;
      auVar7 = vpand_avx(ZEXT416((uint)(fVar5 - fVar4)),auVar7);
      if ((fVar5 != 0.0) || (NAN(fVar5))) {
        auVar8._8_4_ = 0x7fffffff;
        auVar8._0_8_ = 0x7fffffff7fffffff;
        auVar8._12_4_ = 0x7fffffff;
        auVar8 = vpand_avx(ZEXT416((uint)(fVar5 - fVar4)),auVar8);
        auVar9._0_8_ = (double)fVar5;
        auVar9._8_8_ = auVar8._8_8_;
        auVar9 = vpand_avx(auVar9,_DAT_00103050);
        local_88 = (double)auVar8._0_4_ / auVar9._0_8_;
      }
      else {
        local_88 = 0.0;
      }
      if ((in_XMM1_Da < auVar7._0_4_) || (in_XMM2_Da < (float)local_88)) {
        printf("%s: ndims=%d, i=%d, k=%ld, g0=%f, g1=%f, error_abs=%f, error_rel=%f\n",(double)fVar5
               ,(double)fVar4,(double)auVar7._0_4_,(double)(float)local_88,in_RDI,(ulong)in_R8D,
               (ulong)local_4c,local_60);
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/tests/test-mul-mat0.c"
                      ,0x91,
                      "_Bool check_gradient(const char *, struct ggml_context *, struct ggml_tensor **, struct ggml_tensor *, int, int, float, float, float)"
                     );
      }
    }
    local_4c = local_4c + 1;
  } while( true );
}

Assistant:

bool check_gradient(
        const char * op_name,
        struct ggml_context * ctx0,
        struct ggml_tensor * x[],
        struct ggml_tensor * f,
        int ndims,
        int nargs,
        float eps,
        float max_error_abs,
        float max_error_rel) {
    const int n_threads = 1;
    ggml_set_loss(f);

    struct ggml_cgraph * gf = ggml_new_graph_custom(ctx0, GGML_DEFAULT_GRAPH_SIZE, true);
    ggml_build_forward_expand(gf, f);
    struct ggml_cgraph * gb = ggml_graph_dup(ctx0, gf);
    ggml_build_backward_expand(ctx0, ctx0, gb, false);

    ggml_graph_compute_with_ctx(ctx0, gf, n_threads);
    ggml_graph_reset(gb);
    ggml_graph_compute_with_ctx(ctx0, gb, n_threads);

    ggml_graph_dump_dot(gf, NULL, "test-grad0-forward.dot");
    ggml_graph_dump_dot(gb, gf,   "test-grad0-backward.dot");

    for (int i = 0; i < nargs; ++i) {
        const int64_t nelements = ggml_nelements(x[i]);
        for (int64_t k = 0; k < nelements; ++k) {
            // compute gradient using finite differences
            const float x0 = get_element(x[i], k);

            set_element(x[i], k, x0 + eps);
            ggml_graph_compute_with_ctx(ctx0, gf, n_threads);

            const float f0 = ggml_get_f32_1d(f, 0);

            set_element(x[i], k, x0 - eps);
            ggml_graph_compute_with_ctx(ctx0, gf, n_threads);

            const float f1 = ggml_get_f32_1d(f, 0);

            const float g0 = (f0 - f1)/(2.0f*eps);

            set_element(x[i], k, x0);

            // compute gradient using backward graph
            ggml_graph_reset(gb);
            ggml_graph_compute_with_ctx(ctx0, gb, n_threads);

            const float g1 = get_element(ggml_graph_get_grad(gb, x[i]), k);

            const float error_abs = fabsf(g0 - g1);
            const float error_rel = g0 != 0 ? fabsf(g0 - g1)/fabs(g0) : 0;

            if (error_abs > max_error_abs || error_rel > max_error_rel) {
                printf("%s: ndims=%d, i=%d, k=%" PRId64 ", g0=%f, g1=%f, error_abs=%f, error_rel=%f\n", op_name, ndims, i, k, g0, g1, error_abs, error_rel);
                assert(false);
            }
        }
    }

    return true;
}